

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

RCOError __thiscall RCO::getIdStringString(RCO *this,string *s,uint32_t offset,bool loopback)

{
  char local_128 [4];
  uint32_t loopback_val;
  char buf [256];
  bool loopback_local;
  uint32_t offset_local;
  string *s_local;
  RCO *this_local;
  
  memset(local_128,0,0x100);
  memcpy(local_128,this->mBuffer + (ulong)offset + (ulong)(this->mHeader).id_str_start_off + 4,0xff)
  ;
  std::__cxx11::string::operator=((string *)s,local_128);
  return NO_ERROR;
}

Assistant:

RCOError RCO::getIdStringString(std::string& s, uint32_t offset, bool loopback = false)
{
	char buf[256];
	uint32_t loopback_val;

	memcpy(&loopback_val, mBuffer + mHeader.id_str_start_off + offset, sizeof(uint32_t));
	memset(buf, 0, 256);
	memcpy(buf, mBuffer + mHeader.id_str_start_off + offset + sizeof(uint32_t), 255 * sizeof(char));

	s = buf;
	return NO_ERROR;
}